

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_ConvertAigToGia(Gia_Man_t *p,Hop_Obj_t *pRoot)

{
  int iVar1;
  Hop_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pRoot);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsConst1(pRoot);
    if (iVar1 == 0) {
      Abc_ConvertAigToGia_rec1(p,pRoot);
      Abc_ConvertAigToGia_rec2(pRoot);
      p_local._4_4_ = (pRoot->field_0).iData;
    }
    else {
      p_local._4_4_ = 1;
    }
    return p_local._4_4_;
  }
  __assert_fail("!Hop_IsComplement(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                ,0x3bc,"int Abc_ConvertAigToGia(Gia_Man_t *, Hop_Obj_t *)");
}

Assistant:

int Abc_ConvertAigToGia( Gia_Man_t * p, Hop_Obj_t * pRoot )
{
    assert( !Hop_IsComplement(pRoot) );
    if ( Hop_ObjIsConst1( pRoot ) )
        return 1;
    Abc_ConvertAigToGia_rec1( p, pRoot );
    Abc_ConvertAigToGia_rec2( pRoot );
    return pRoot->iData;
}